

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-model-loader.cpp
# Opt level: O0

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
GGUFMeta::GKV<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
get_kv(gguf_context *ctx,int k)

{
  runtime_error *this;
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  int in_EDX;
  undefined8 in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  gguf_type kt;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  string local_38 [32];
  int local_18;
  int local_14;
  undefined8 local_10;
  
  local_14 = in_EDX;
  local_10 = in_RSI;
  local_18 = gguf_get_kv_type(in_RSI,(long)in_EDX);
  if (local_18 != 8) {
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    uVar1 = gguf_get_key(local_10,(long)local_14);
    uVar2 = gguf_type_name(local_18);
    uVar3 = gguf_type_name(8);
    format_abi_cxx11_((char *)local_38,"key %s has wrong type %s but expected type %s",uVar1,uVar2,
                      uVar3);
    std::runtime_error::runtime_error(this,local_38);
    __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  GKV_Base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::getter
            ((gguf_context *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
             (int)((ulong)in_RDI >> 0x20));
  return in_RDI;
}

Assistant:

static T get_kv(const gguf_context * ctx, const int k) {
            const enum gguf_type kt = gguf_get_kv_type(ctx, k);

            if (kt != GKV::gt) {
                throw std::runtime_error(format("key %s has wrong type %s but expected type %s",
                    gguf_get_key(ctx, k), gguf_type_name(kt), gguf_type_name(GKV::gt)));
            }
            return GKV::getter(ctx, k);
        }